

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_client.h
# Opt level: O2

int __thiscall
blcl::net::client_interface<MsgType>::connect
          (client_interface<MsgType> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  io_context *context;
  char *pcVar1;
  size_t sVar2;
  connection<MsgType> *pcVar3;
  _Head_base<0UL,_blcl::net::connection<MsgType>_*,_false> _Var4;
  undefined4 in_register_00000034;
  string_view host;
  string_view service;
  _Head_base<0UL,_blcl::net::connection<MsgType>_*,_false> local_e8;
  undefined1 local_dc [4];
  results_type endpoints;
  undefined1 local_c0 [80];
  resolver resolver;
  
  context = &this->context_;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&resolver,context,0);
  pcVar1 = *(char **)CONCAT44(in_register_00000034,__fd);
  sVar2 = ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
  std::__cxx11::to_string((string *)local_c0,(uint)__addr & 0xffff);
  host._M_str = pcVar1;
  host._M_len = sVar2;
  service._M_str = (char *)local_c0._0_8_;
  service._M_len = local_c0._8_8_;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            (&endpoints,&resolver,host,service);
  std::__cxx11::string::~string((string *)local_c0);
  local_dc = (undefined1  [4])0x1;
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)local_c0,context,0);
  std::
  make_unique<blcl::net::connection<MsgType>,blcl::net::connection<MsgType>::owner,asio::io_context&,asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,blcl::net::tsqueue<blcl::net::owned_message<MsgType>>&>
            ((owner *)&local_e8,(io_context *)local_dc,
             (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)context,
             (tsqueue<blcl::net::owned_message<MsgType>_> *)local_c0);
  _Var4._M_head_impl = local_e8._M_head_impl;
  local_e8._M_head_impl = (connection<MsgType> *)0x0;
  pcVar3 = (this->connection_)._M_t.
           super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
           .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl;
  (this->connection_)._M_t.
  super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
  .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (pcVar3 != (connection<MsgType> *)0x0) {
    (*pcVar3->_vptr_connection[1])();
    if (local_e8._M_head_impl != (connection<MsgType> *)0x0) {
      (*(local_e8._M_head_impl)->_vptr_connection[1])();
    }
  }
  local_e8._M_head_impl = (connection<MsgType> *)0x0;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)local_c0);
  connection<MsgType>::connect_to_server
            ((this->connection_)._M_t.
             super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
             .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl,&endpoints
            );
  local_e8._M_head_impl = (connection<MsgType> *)this;
  std::thread::
  thread<blcl::net::client_interface<MsgType>::connect(std::__cxx11::string_const&,unsigned_short)::_lambda()_1_,,void>
            ((thread *)local_c0,(anon_class_8_1_8991fb9c_for__M_head_impl *)&local_e8);
  std::thread::operator=(&this->ctx_thread_,(thread *)local_c0);
  std::thread::~thread((thread *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&endpoints.super_basic_resolver_iterator<asio::ip::tcp>.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  return 0;
}

Assistant:

bool connect(const std::string& host, const uint16_t port) {
            try {
                asio::ip::tcp::resolver resolver(context_);
                auto endpoints = resolver.resolve(host, std::to_string(port));

                connection_ = std::make_unique<connection<T>>(
                        connection<T>::owner::client, context_, asio::ip::tcp::socket(context_), incoming_messages_);
                connection_->connect_to_server(endpoints);
                ctx_thread_ = std::thread([this]() { context_.run(); });
            } catch (std::exception& e) {
                std::cerr << "Client exception: " << e.what() << '\n';
                return false;
            }

            return false;
        }